

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O3

void av1_highbd_iwht4x4_1_add_c(tran_low_t *in,uint8_t *dest8,int dest_stride,int bd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined2 uVar9;
  bool bVar10;
  int local_38 [6];
  tran_low_t tmp [4];
  
  lVar4 = (long)dest8 * 2;
  local_38[3] = *in >> 3;
  local_38[0] = (*in >> 2) - local_38[3];
  local_38[2] = local_38[3];
  local_38[1] = local_38[3];
  lVar1 = (long)dest_stride * 2 + (long)dest8 * 2;
  lVar2 = (long)(dest_stride * 2) * 2 + (long)dest8 * 2;
  lVar3 = (long)(dest_stride * 3) * 2 + (long)dest8 * 2;
  lVar5 = 0;
  do {
    iVar6 = local_38[lVar5] >> 1;
    uVar7 = (uint)*(ushort *)(lVar4 + lVar5 * 2) + (local_38[lVar5] - iVar6);
    if (bd == 0xc) {
      uVar8 = 0xfff;
      if (uVar7 < 0xfff) {
        uVar8 = uVar7;
      }
      uVar9 = (undefined2)uVar8;
      if ((int)uVar7 < 0) {
        uVar9 = 0;
      }
      *(undefined2 *)(lVar4 + lVar5 * 2) = uVar9;
      uVar8 = (uint)*(ushort *)(lVar1 + lVar5 * 2) + iVar6;
      uVar7 = 0xfff;
      if (uVar8 < 0xfff) {
        uVar7 = uVar8;
      }
      uVar9 = (undefined2)uVar7;
      if ((int)uVar8 < 0) {
        uVar9 = 0;
      }
      *(undefined2 *)(lVar1 + lVar5 * 2) = uVar9;
      uVar8 = (uint)*(ushort *)(lVar2 + lVar5 * 2) + iVar6;
      uVar7 = 0xfff;
      if (uVar8 < 0xfff) {
        uVar7 = uVar8;
      }
      uVar9 = (undefined2)uVar7;
      if ((int)uVar8 < 0) {
        uVar9 = 0;
      }
      *(undefined2 *)(lVar2 + lVar5 * 2) = uVar9;
      uVar7 = (uint)*(ushort *)(lVar3 + lVar5 * 2) + iVar6;
      bVar10 = uVar7 < 0xfff;
      uVar9 = 0xfff;
    }
    else if (bd == 10) {
      uVar8 = 0x3ff;
      if (uVar7 < 0x3ff) {
        uVar8 = uVar7;
      }
      uVar9 = (undefined2)uVar8;
      if ((int)uVar7 < 0) {
        uVar9 = 0;
      }
      *(undefined2 *)(lVar4 + lVar5 * 2) = uVar9;
      uVar8 = (uint)*(ushort *)(lVar1 + lVar5 * 2) + iVar6;
      uVar7 = 0x3ff;
      if (uVar8 < 0x3ff) {
        uVar7 = uVar8;
      }
      uVar9 = (undefined2)uVar7;
      if ((int)uVar8 < 0) {
        uVar9 = 0;
      }
      *(undefined2 *)(lVar1 + lVar5 * 2) = uVar9;
      uVar8 = (uint)*(ushort *)(lVar2 + lVar5 * 2) + iVar6;
      uVar7 = 0x3ff;
      if (uVar8 < 0x3ff) {
        uVar7 = uVar8;
      }
      uVar9 = (undefined2)uVar7;
      if ((int)uVar8 < 0) {
        uVar9 = 0;
      }
      *(undefined2 *)(lVar2 + lVar5 * 2) = uVar9;
      uVar7 = (uint)*(ushort *)(lVar3 + lVar5 * 2) + iVar6;
      bVar10 = uVar7 < 0x3ff;
      uVar9 = 0x3ff;
    }
    else {
      uVar8 = 0xff;
      if (uVar7 < 0xff) {
        uVar8 = uVar7;
      }
      uVar9 = (undefined2)uVar8;
      if ((int)uVar7 < 0) {
        uVar9 = 0;
      }
      *(undefined2 *)(lVar4 + lVar5 * 2) = uVar9;
      uVar8 = (uint)*(ushort *)(lVar1 + lVar5 * 2) + iVar6;
      uVar7 = 0xff;
      if (uVar8 < 0xff) {
        uVar7 = uVar8;
      }
      uVar9 = (undefined2)uVar7;
      if ((int)uVar8 < 0) {
        uVar9 = 0;
      }
      *(undefined2 *)(lVar1 + lVar5 * 2) = uVar9;
      uVar8 = (uint)*(ushort *)(lVar2 + lVar5 * 2) + iVar6;
      uVar7 = 0xff;
      if (uVar8 < 0xff) {
        uVar7 = uVar8;
      }
      uVar9 = (undefined2)uVar7;
      if ((int)uVar8 < 0) {
        uVar9 = 0;
      }
      *(undefined2 *)(lVar2 + lVar5 * 2) = uVar9;
      uVar7 = (uint)*(ushort *)(lVar3 + lVar5 * 2) + iVar6;
      bVar10 = uVar7 < 0xff;
      uVar9 = 0xff;
    }
    if (bVar10) {
      uVar9 = (undefined2)uVar7;
    }
    if ((int)uVar7 < 0) {
      uVar9 = 0;
    }
    *(undefined2 *)(lVar3 + lVar5 * 2) = uVar9;
    lVar5 = lVar5 + 1;
  } while ((int)lVar5 != 4);
  return;
}

Assistant:

void av1_highbd_iwht4x4_1_add_c(const tran_low_t *in, uint8_t *dest8,
                                int dest_stride, int bd) {
  int i;
  tran_low_t a1, e1;
  tran_low_t tmp[4];
  const tran_low_t *ip = in;
  tran_low_t *op = tmp;
  uint16_t *dest = CONVERT_TO_SHORTPTR(dest8);
  (void)bd;

  a1 = ip[0 * 4] >> UNIT_QUANT_SHIFT;
  e1 = a1 >> 1;
  a1 -= e1;
  op[0] = a1;
  op[1] = op[2] = op[3] = e1;

  ip = tmp;
  for (i = 0; i < 4; i++) {
    e1 = ip[0] >> 1;
    a1 = ip[0] - e1;
    dest[dest_stride * 0] =
        highbd_clip_pixel_add(dest[dest_stride * 0], a1, bd);
    dest[dest_stride * 1] =
        highbd_clip_pixel_add(dest[dest_stride * 1], e1, bd);
    dest[dest_stride * 2] =
        highbd_clip_pixel_add(dest[dest_stride * 2], e1, bd);
    dest[dest_stride * 3] =
        highbd_clip_pixel_add(dest[dest_stride * 3], e1, bd);
    ip++;
    dest++;
  }
}